

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFunction<duckdb::ModeStandard<long>>::
     Window<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long,long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  ValidityMask *pVVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  long lVar4;
  pointer pFVar5;
  bool bVar6;
  Allocator *pAVar7;
  MAP_TYPE *pMVar8;
  reference pvVar9;
  const_reference pvVar10;
  const_iterator cVar11;
  FrameBounds *frame;
  pointer pFVar12;
  byte bVar13;
  Updater updater;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> included;
  
  ModeState<long,_duckdb::ModeStandard<long>_>::InitializePage
            ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,partition);
  pVVar1 = partition->filter_mask;
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  pMVar8 = *(MAP_TYPE **)(l_state + 0x18);
  included.fmask = pVVar1;
  included.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)l_state;
  if (pMVar8 == (MAP_TYPE *)0x0) {
    pAVar7 = Allocator::DefaultAllocator();
    pMVar8 = ModeStandard<long>::CreateEmpty(pAVar7);
    *(MAP_TYPE **)(l_state + 0x18) = pMVar8;
  }
  if ((pMVar8->_M_h)._M_element_count >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar9 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar3 = pvVar9->end;
    pvVar10 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar10->start < uVar3) {
      pvVar10 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar3 = pvVar10->end;
      pvVar9 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar9->start < uVar3) {
        updater.included = &included;
        updater.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<long>>::UpdateWindowState<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long>>
                  ((SubFrames *)l_state,frames,&updater);
        goto LAB_01c29ff5;
      }
    }
  }
  ModeState<long,_duckdb::ModeStandard<long>_>::Reset
            ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state);
  pFVar5 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar12 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_start; pFVar12 != pFVar5; pFVar12 = pFVar12 + 1)
  {
    for (updater.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)pFVar12->start;
        updater.state < (ModeState<long,_duckdb::ModeStandard<long>_> *)pFVar12->end;
        updater.state =
             (ModeState<long,_duckdb::ModeStandard<long>_> *)
             ((long)&((updater.state)->prevs).
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar6 = ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_>::operator()
                        (&included,(idx_t *)&updater);
      if (bVar6) {
        ModeState<long,_duckdb::ModeStandard<long>_>::ModeAdd
                  ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,(idx_t)updater.state);
      }
    }
  }
LAB_01c29ff5:
  bVar13 = l_state[0x30];
  if (bVar13 == 0) {
    cVar11 = ModeState<long,_duckdb::ModeStandard<long>_>::Scan
                       ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state);
    if (cVar11.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>._M_cur ==
        (__node_type *)0x0) {
      bVar13 = l_state[0x30];
    }
    else {
      **(undefined8 **)(l_state + 0x20) =
           *(undefined8 *)
            ((long)cVar11.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>.
                   _M_cur + 8);
      lVar4 = *(long *)((long)cVar11.
                              super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>
                              ._M_cur + 0x10);
      *(long *)(l_state + 0x38) = lVar4;
      bVar13 = lVar4 != 0;
      l_state[0x30] = bVar13;
    }
  }
  if ((bVar13 & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,rid);
  }
  else {
    *(undefined8 *)(pdVar2 + rid * 8) = **(undefined8 **)(l_state + 0x20);
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}